

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O2

void __thiscall xray_re::xr_scene_wallmarks::~xr_scene_wallmarks(xr_scene_wallmarks *this)

{
  (this->super_xr_scene_part)._vptr_xr_scene_part = (_func_int **)&PTR__xr_scene_wallmarks_0023a218;
  delete_elements<std::vector<xray_re::wm_slot_le*,std::allocator<xray_re::wm_slot_le*>>>
            (&this->m_slots);
  std::_Vector_base<xray_re::wm_slot_le_*,_std::allocator<xray_re::wm_slot_le_*>_>::~_Vector_base
            (&(this->m_slots).
              super__Vector_base<xray_re::wm_slot_le_*,_std::allocator<xray_re::wm_slot_le_*>_>);
  std::__cxx11::string::~string((string *)&this->m_texture);
  std::__cxx11::string::~string((string *)&this->m_shader);
  xr_scene_part::~xr_scene_part(&this->super_xr_scene_part);
  return;
}

Assistant:

xr_scene_wallmarks::~xr_scene_wallmarks()
{
	delete_elements(m_slots);
}